

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

TCGArg do_constant_folding(TCGContext_conflict9 *s,TCGOpcode op,TCGArg x,TCGArg y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  TCGArg TVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (0x6f < op - INDEX_op_add_i32) {
switchD_00b58ed3_caseD_18:
    fprintf(_stderr,"Unrecognized operation %d in do_constant_folding.\n",(ulong)op);
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/optimize.c"
            ,0x19d);
    abort();
  }
  uVar6 = (uint)x;
  uVar5 = (ushort)x;
  bVar4 = (byte)y;
  uVar7 = (uint)y;
  switch(op) {
  case INDEX_op_add_i32:
  case INDEX_op_add_i64:
    y = y + x;
    break;
  case INDEX_op_sub_i32:
  case INDEX_op_sub_i64:
    y = x - y;
    break;
  case INDEX_op_mul_i32:
  case INDEX_op_mul_i64:
    y = y * x;
    break;
  case INDEX_op_div_i32:
    uVar9 = 1;
    if (1 < uVar7) {
      uVar9 = uVar7;
    }
    y = (long)(int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | x & 0xffffffff) /
                   (long)(int)uVar9);
    break;
  case INDEX_op_divu_i32:
    uVar8 = 1;
    if (1 < uVar7) {
      uVar8 = y & 0xffffffff;
    }
    y = (x & 0xffffffff) / uVar8;
    break;
  case INDEX_op_rem_i32:
    uVar9 = 1;
    if (1 < uVar7) {
      uVar9 = uVar7;
    }
    y = (long)(int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | x & 0xffffffff) %
                   (long)(int)uVar9);
    break;
  case INDEX_op_remu_i32:
    uVar8 = 1;
    if (1 < uVar7) {
      uVar8 = y & 0xffffffff;
    }
    y = (x & 0xffffffff) % uVar8;
    break;
  default:
    goto switchD_00b58ed3_caseD_18;
  case INDEX_op_xor_i32:
  case INDEX_op_xor_i64:
    y = y ^ x;
    break;
  case INDEX_op_shl_i32:
    y = (TCGArg)(uVar6 << (bVar4 & 0x1f));
    break;
  case INDEX_op_shr_i32:
    y = (TCGArg)(uVar6 >> (bVar4 & 0x1f));
    break;
  case INDEX_op_sar_i32:
    x = (TCGArg)(uint)((int)uVar6 >> (bVar4 & 0x1f));
  case INDEX_op_ext_i32_i64:
  case INDEX_op_ext32s_i64:
    y = (long)(int)x;
    break;
  case INDEX_op_rotl_i32:
    y = (TCGArg)(uVar6 << (bVar4 & 0x1f) | uVar6 >> 0x20 - (bVar4 & 0x1f));
    break;
  case INDEX_op_rotr_i32:
    y = (TCGArg)(uVar6 >> (bVar4 & 0x1f) | uVar6 << 0x20 - (bVar4 & 0x1f));
    break;
  case INDEX_op_muluh_i32:
    y = (y & 0xffffffff) * (x & 0xffffffff) >> 0x20;
    break;
  case INDEX_op_mulsh_i32:
    y = (long)(int)uVar7 * (long)(int)uVar6 >> 0x20;
    break;
  case INDEX_op_ext8s_i32:
  case INDEX_op_ext8s_i64:
    y = (long)(char)x;
    break;
  case INDEX_op_ext16s_i32:
  case INDEX_op_ext16s_i64:
    y = (long)(short)uVar5;
    break;
  case INDEX_op_ext8u_i32:
  case INDEX_op_ext8u_i64:
    y = x & 0xff;
    break;
  case INDEX_op_bswap16_i32:
  case INDEX_op_bswap16_i64:
    x = (TCGArg)(ushort)(uVar5 << 8 | uVar5 >> 8);
  case INDEX_op_ext16u_i32:
  case INDEX_op_ext16u_i64:
    y = x & 0xffff;
    break;
  case INDEX_op_bswap32_i32:
  case INDEX_op_bswap32_i64:
    y = (TCGArg)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18);
    break;
  case INDEX_op_not_i32:
  case INDEX_op_not_i64:
    y = ~x;
    break;
  case INDEX_op_neg_i32:
  case INDEX_op_neg_i64:
    y = -x;
    break;
  case INDEX_op_andc_i32:
  case INDEX_op_andc_i64:
    y = ~y;
  case INDEX_op_and_i32:
  case INDEX_op_and_i64:
    y = y & x;
    break;
  case INDEX_op_orc_i32:
  case INDEX_op_orc_i64:
    y = ~y;
  case INDEX_op_or_i32:
  case INDEX_op_or_i64:
    y = y | x;
    break;
  case INDEX_op_eqv_i32:
  case INDEX_op_eqv_i64:
    uVar8 = y ^ x;
    goto LAB_00b58f5d;
  case INDEX_op_nand_i32:
  case INDEX_op_nand_i64:
    uVar8 = y & x;
    goto LAB_00b58f5d;
  case INDEX_op_nor_i32:
  case INDEX_op_nor_i64:
    uVar8 = y | x;
LAB_00b58f5d:
    y = ~uVar8;
    break;
  case INDEX_op_clz_i32:
    if (uVar6 != 0) {
      uVar7 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      y = (ulong)(uVar7 ^ 0x1f);
    }
    break;
  case INDEX_op_ctz_i32:
    if (uVar6 != 0) {
      uVar7 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      y = (ulong)uVar7;
    }
    break;
  case INDEX_op_ctpop_i32:
    uVar6 = uVar6 - ((uint)(x >> 1) & 0x55555555);
    uVar7 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
    y = (ulong)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f) * 0x1010101 >> 0x18);
    break;
  case INDEX_op_div_i64:
    y = (long)x / (long)(y + (y == 0));
    break;
  case INDEX_op_divu_i64:
    y = x / (y + (y == 0));
    break;
  case INDEX_op_rem_i64:
    y = (long)x % (long)(y + (y == 0));
    break;
  case INDEX_op_remu_i64:
    y = x % (y + (y == 0));
    break;
  case INDEX_op_shl_i64:
    y = x << (bVar4 & 0x3f);
    break;
  case INDEX_op_shr_i64:
    y = x >> (bVar4 & 0x3f);
    break;
  case INDEX_op_sar_i64:
    y = (long)x >> (bVar4 & 0x3f);
    break;
  case INDEX_op_rotl_i64:
    y = x << (bVar4 & 0x3f) | x >> 0x40 - (bVar4 & 0x3f);
    break;
  case INDEX_op_rotr_i64:
    y = x >> (bVar4 & 0x3f) | x << 0x40 - (bVar4 & 0x3f);
    break;
  case INDEX_op_extu_i32_i64:
  case INDEX_op_extrl_i64_i32:
  case INDEX_op_ext32u_i64:
    y = x & 0xffffffff;
    break;
  case INDEX_op_extrh_i64_i32:
    y = x >> 0x20;
    break;
  case INDEX_op_bswap64_i64:
    y = x >> 0x38 | (x & 0xff000000000000) >> 0x28 | (x & 0xff0000000000) >> 0x18 |
        (x & 0xff00000000) >> 8 | (x & 0xff000000) << 8 | (x & 0xff0000) << 0x18 |
        (x & 0xff00) << 0x28 | x << 0x38;
    break;
  case INDEX_op_clz_i64:
    uVar8 = 0x3f;
    if (x != 0) {
      for (; x >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = uVar8 ^ 0x3f;
    goto LAB_00b590c0;
  case INDEX_op_ctz_i64:
    uVar8 = 0;
    if (x != 0) {
      for (; (x >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
LAB_00b590c0:
    if (x != 0) {
      y = uVar8;
    }
    break;
  case INDEX_op_ctpop_i64:
    uVar8 = x - (x >> 1 & 0x5555555555555555);
    uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
    y = ((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
    break;
  case INDEX_op_muluh_i64:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = y;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = x;
    y = SUB168(auVar1 * auVar2,8);
    break;
  case INDEX_op_mulsh_i64:
    y = SUB168(SEXT816((long)y) * SEXT816((long)x),8);
  }
  TVar3 = (long)(int)y;
  if ((s->tcg_op_defs[op].flags & 0x10) != 0) {
    TVar3 = y;
  }
  return TVar3;
}

Assistant:

static TCGArg do_constant_folding(TCGContext *s, TCGOpcode op, TCGArg x, TCGArg y)
{
    const TCGOpDef *def = &s->tcg_op_defs[op];
    TCGArg res = do_constant_folding_2(op, x, y);
    if (!(def->flags & TCG_OPF_64BIT)) {
        res = (int32_t)res;
    }
    return res;
}